

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O1

void mafilter2(double *sig,int N,int window,double *oup)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  uVar1 = window - (window >> 0x1f);
  uVar6 = uVar1 & 0xfffffffe;
  if (uVar6 != window) {
    uVar1 = (window - (window + -1 >> 0x1f)) - 1;
  }
  uVar1 = (int)uVar1 >> 1;
  if (uVar6 == window) {
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        oup[uVar7] = sig[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    if ((int)uVar1 < (int)(N - uVar1)) {
      uVar2 = uVar1 * 2;
      uVar6 = uVar1 * 2;
      lVar8 = (long)(int)uVar1;
      lVar3 = 0;
      uVar7 = 0;
      pdVar4 = sig;
      lVar9 = lVar8;
      do {
        uVar6 = uVar6 + 1;
        dVar10 = 0.0;
        if (lVar9 - lVar8 <= lVar9 + lVar8) {
          dVar10 = 0.0;
          lVar5 = 0;
          do {
            dVar11 = pdVar4[lVar5] * 0.5 + dVar10;
            dVar12 = dVar11;
            if ((ulong)uVar2 + lVar3 != lVar5) {
              dVar12 = dVar10 + pdVar4[lVar5];
            }
            dVar10 = dVar11;
            if (lVar5 != 0) {
              dVar10 = dVar12;
            }
            lVar5 = lVar5 + 1;
          } while ((ulong)uVar6 + lVar3 != lVar5);
        }
        oup[lVar9] = dVar10 / (double)window;
        lVar9 = lVar9 + 1;
        uVar7 = uVar7 + 1;
        pdVar4 = pdVar4 + 1;
        lVar3 = lVar3 + -1;
        uVar2 = uVar2 + 1;
      } while (uVar7 != N + uVar1 * -2);
    }
    if (0 < (int)uVar1) {
      lVar9 = (long)(int)(N - uVar1);
      do {
        oup[lVar9] = sig[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 < N);
    }
  }
  else {
    if (0 < (int)uVar1) {
      uVar7 = 0;
      do {
        oup[uVar7] = sig[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    if ((int)uVar1 < (int)(N - uVar1)) {
      uVar6 = uVar1 * 2;
      lVar3 = (long)(int)uVar1;
      lVar8 = 0;
      uVar7 = 0;
      pdVar4 = sig;
      lVar9 = lVar3;
      do {
        uVar6 = uVar6 + 1;
        dVar10 = 0.0;
        if (lVar9 - lVar3 <= lVar9 + lVar3) {
          lVar5 = 0;
          do {
            dVar10 = dVar10 + pdVar4[lVar5];
            lVar5 = lVar5 + 1;
          } while ((ulong)uVar6 + lVar8 != lVar5);
        }
        oup[lVar9] = dVar10 / (double)window;
        lVar9 = lVar9 + 1;
        uVar7 = uVar7 + 1;
        pdVar4 = pdVar4 + 1;
        lVar8 = lVar8 + -1;
      } while (uVar7 != N + uVar1 * -2);
    }
    if (0 < (int)uVar1) {
      lVar9 = (long)(int)(N - uVar1);
      do {
        oup[lVar9] = sig[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 < N);
    }
  }
  return;
}

Assistant:

void mafilter2(double *sig,int N, int window,double *oup) {
	int odd,q,N2,i,j;
	double sum;
	/*
	 * mafilter2 is a smoothing filter that smoothes a signal by using
	 * a window. No signal extension is done in this case. Instead,
	 * first floor(window/2) signal terms and last [window - floor(window/2)]
	 * terms are left untouched. The smoothing is performed over the rest
	 * of the terms.
	 *
	 */
	
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
	} else {
		q = window / 2;
	}
	
	if (odd) {
		for (i = 0; i < q; i++) {
			oup[i] = sig[i];
		}
		for (i = q; i < N-q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				sum += sig[j];
			}
			oup[i] = sum /window;
		}  
		for (i = N-q; i < N; i++) {
			oup[i] = sig[i];
		}
	} else {
		for (i = 0; i < q; i++) {
			oup[i] = sig[i];
		}
		for (i = q; i < N-q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				if ( j == i - q || j == i + q) {
					sum += 0.5 * sig[j];
				} else {
					sum += sig[j];
				}
			}
			oup[i] = sum /window;
		}  
		for (i = N-q; i < N; i++) {
			oup[i] = sig[i];
		}
	}
}